

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseCacheCoverage.cxx
# Opt level: O1

bool __thiscall cmParseCacheCoverage::LoadCoverageData(cmParseCacheCoverage *this,string *d)

{
  bool bVar1;
  int iVar2;
  Status SVar3;
  unsigned_long uVar4;
  char *__s;
  unsigned_long dindex;
  ulong uVar5;
  bool bVar6;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  Directory dir;
  string file;
  string path;
  Directory local_e0;
  string local_d8;
  string local_b8;
  cmParseCacheCoverage *local_98;
  string local_90;
  size_type local_70;
  pointer local_68;
  undefined8 local_60;
  undefined1 *local_58;
  undefined1 local_50 [32];
  
  local_98 = this;
  cmsys::Directory::Directory(&local_e0);
  SVar3 = cmsys::Directory::Load(&local_e0,d,(string *)0x0);
  if (SVar3.Kind_ == Success) {
    uVar4 = cmsys::Directory::GetNumberOfFiles(&local_e0);
    bVar6 = uVar4 == 0;
    if (!bVar6) {
      dindex = 0;
      uVar5 = 1;
      do {
        __s = cmsys::Directory::GetFile(&local_e0,dindex);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d8,__s,(allocator<char> *)&local_90);
        iVar2 = std::__cxx11::string::compare((char *)&local_d8);
        if (iVar2 != 0) {
          iVar2 = std::__cxx11::string::compare((char *)&local_d8);
          if (iVar2 != 0) {
            bVar6 = cmsys::SystemTools::FileIsDirectory(&local_d8);
            if (!bVar6) {
              local_90._M_string_length = (size_type)(d->_M_dataplus)._M_p;
              local_90._M_dataplus._M_p = (pointer)d->_M_string_length;
              local_60 = 1;
              local_90.field_2._8_8_ = local_50;
              local_50[0] = 0x2f;
              local_90.field_2._M_allocated_capacity = 1;
              local_70 = local_d8._M_string_length;
              local_68 = local_d8._M_dataplus._M_p;
              views._M_len = 3;
              views._M_array = (iterator)&local_90;
              local_58 = (undefined1 *)local_90.field_2._8_8_;
              cmCatViews_abi_cxx11_(&local_b8,views);
              cmsys::SystemTools::GetFilenameLastExtension(&local_90,&local_b8);
              iVar2 = std::__cxx11::string::compare((char *)&local_90);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != &local_90.field_2) {
                operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1
                               );
              }
              if (iVar2 == 0) {
                bVar6 = ReadCMCovFile(local_98,local_b8._M_dataplus._M_p);
                if (!bVar6) {
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                    operator_delete(local_b8._M_dataplus._M_p,
                                    local_b8.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                    operator_delete(local_d8._M_dataplus._M_p,
                                    local_d8.field_2._M_allocated_capacity + 1);
                  }
                  goto LAB_0056baf1;
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1
                               );
              }
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        bVar6 = uVar4 <= uVar5;
        bVar1 = uVar5 < uVar4;
        dindex = uVar5;
        uVar5 = (ulong)((int)uVar5 + 1);
      } while (bVar1);
    }
  }
  else {
LAB_0056baf1:
    bVar6 = false;
  }
  cmsys::Directory::~Directory(&local_e0);
  return bVar6;
}

Assistant:

bool cmParseCacheCoverage::LoadCoverageData(std::string const& d)
{
  // load all the .mcov files in the specified directory
  cmsys::Directory dir;
  if (!dir.Load(d)) {
    return false;
  }
  size_t numf;
  unsigned int i;
  numf = dir.GetNumberOfFiles();
  for (i = 0; i < numf; i++) {
    std::string file = dir.GetFile(i);
    if (file != "." && file != ".." && !cmSystemTools::FileIsDirectory(file)) {
      std::string path = cmStrCat(d, '/', file);
      if (cmSystemTools::GetFilenameLastExtension(path) == ".cmcov") {
        if (!this->ReadCMCovFile(path.c_str())) {
          return false;
        }
      }
    }
  }
  return true;
}